

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.hpp
# Opt level: O0

void __thiscall
ylt::metric::basic_dynamic_histogram<long,_(unsigned_char)'\x02'>::basic_dynamic_histogram
          (basic_dynamic_histogram<long,_(unsigned_char)__x02_> *this,string *name,string *help,
          vector<double,_std::allocator<double>_> *buckets,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *labels_name)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  size_t i;
  value_type *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  string *in_stack_fffffffffffffee8;
  ulong uVar2;
  string *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  MetricType MVar3;
  dynamic_metric *in_stack_ffffffffffffff00;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  ulong local_c0;
  
  MVar3 = (MetricType)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  std::__cxx11::string::string(in_RDI,in_R8);
  std::__cxx11::string::string(in_RDI,in_R8);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
         *)in_RDI,
        (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
         *)in_R8);
  dynamic_metric::metric_t<2ul>
            (in_stack_ffffffffffffff00,MVar3,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *)in_stack_fffffffffffffee0);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *)in_stack_fffffffffffffef0);
  std::__cxx11::string::~string(in_stack_fffffffffffffee0);
  std::__cxx11::string::~string(in_stack_fffffffffffffee0);
  (in_RDI->_M_dataplus)._M_p = (pointer)&PTR__basic_dynamic_histogram_0032b2c8;
  std::vector<double,_std::allocator<double>_>::vector(in_stack_ffffffffffffff30,in_RDX);
  std::
  vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x02'>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x02'>_>_>_>
  ::vector((vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>_>_>
            *)0x22e779);
  std::
  make_shared<ylt::metric::basic_dynamic_gauge<long,(unsigned_char)2>,std::__cxx11::string&,std::__cxx11::string&,std::array<std::__cxx11::string,2ul>&>
            (in_R8,in_RCX,in_RSI);
  local_c0 = 0;
  while( true ) {
    uVar2 = local_c0;
    sVar1 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)in_RCX);
    if (sVar1 + 1 <= uVar2) break;
    this_00 = &in_RDI[6].field_2;
    std::
    make_shared<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>,std::__cxx11::string&,std::__cxx11::string&,std::array<std::__cxx11::string,2ul>&>
              (in_R8,in_RCX,in_RSI);
    std::
    vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x02'>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x02'>_>_>_>
    ::push_back((vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>_>_>
                 *)this_00,in_stack_fffffffffffffed8);
    std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x02'>_>::~shared_ptr
              ((shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_> *)
               0x22e818);
    local_c0 = local_c0 + 1;
  }
  return;
}

Assistant:

basic_dynamic_histogram(std::string name, std::string help,
                          std::vector<double> buckets,
                          std::array<std::string, N> labels_name)
      : bucket_boundaries_(buckets),
        dynamic_metric(MetricType::Histogram, name, help, labels_name),
        sum_(std::make_shared<basic_dynamic_gauge<value_type, N>>(
            name, help, labels_name)) {
    for (size_t i = 0; i < buckets.size() + 1; i++) {
      bucket_counts_.push_back(
          std::make_shared<basic_dynamic_counter<value_type, N>>(name, help,
                                                                 labels_name));
    }
  }